

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64instapi.cpp
# Opt level: O0

Error asmjit::v1_14::a64::InstInternal::queryRWInfo
                (BaseInst *inst,Operand_ *operands,size_t opCount,InstRWInfo *out)

{
  byte bVar1;
  bool bVar2;
  OpRWFlags *pOVar3;
  undefined8 uVar4;
  undefined4 *in_RCX;
  long lVar5;
  ulong in_RDX;
  long in_RSI;
  uint *in_RDI;
  Mem *memOp_1;
  uint64_t accessMask;
  uint32_t elementSize;
  uint32_t elementIndex;
  VecElementType elementType;
  uint64_t wByteMask_1;
  uint64_t rByteMask_1;
  OpRWFlags rwFlags_1;
  Operand_ *srcOp_1;
  OpRWInfo *op_1;
  uint32_t i_1;
  Mem *memOp;
  uint64_t wByteMask;
  uint64_t rByteMask;
  OpRWFlags rwFlags;
  Operand_ *srcOp;
  OpRWInfo *op;
  uint32_t i;
  InstRWInfoData *rwInfo;
  InstInfo *instInfo;
  uint32_t realId;
  bool local_5c5;
  OpRWFlags local_5c4;
  bool local_5b1;
  uint local_58c;
  uint local_588;
  uint local_584;
  undefined8 local_580;
  undefined8 local_578;
  OpRWFlags local_56c;
  uint *local_568;
  OpRWFlags *local_560;
  uint local_554;
  uint *local_550;
  undefined8 local_548;
  undefined8 local_540;
  OpRWFlags local_534;
  uint *local_530;
  OpRWFlags *local_528;
  uint local_51c;
  byte *local_518;
  undefined1 *local_510;
  uint local_504;
  undefined4 *local_500;
  ulong local_4f8;
  long local_4f0;
  Error local_4e0;
  uint local_4dc;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  OpRWFlags *local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  OpRWFlags *local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 *local_460;
  undefined1 *local_458;
  undefined4 local_44c;
  undefined1 *local_448;
  undefined4 local_43c;
  undefined4 local_438;
  uint local_434;
  uint *local_430;
  undefined4 local_424;
  undefined4 local_420;
  uint local_41c;
  uint *local_418;
  undefined4 local_410;
  OpRWFlags local_40c;
  undefined4 local_408;
  OpRWFlags local_404;
  undefined4 local_400;
  undefined4 local_3fc;
  OpRWFlags *local_3f8;
  OpRWFlags *local_3f0;
  OpRWFlags *local_3e8;
  OpRWFlags *local_3e0;
  OpRWFlags *local_3d8;
  OpRWFlags *local_3d0;
  uint *local_3c8;
  uint *local_3c0;
  undefined4 local_3b4;
  OpRWFlags *local_3b0;
  undefined4 local_3a4;
  OpRWFlags *local_3a0;
  undefined4 local_394;
  OpRWFlags *local_390;
  undefined4 local_384;
  OpRWFlags *local_380;
  undefined4 local_374;
  OpRWFlags *local_370;
  undefined4 local_364;
  OpRWFlags *local_360;
  undefined4 local_354;
  OpRWFlags *local_350;
  uint *local_348;
  uint *local_340;
  uint local_334;
  uint *local_330;
  uint local_324;
  uint *local_320;
  uint local_314;
  uint *local_310;
  uint local_304;
  uint *local_300;
  uint local_2f4;
  uint *local_2f0;
  uint local_2e4;
  uint *local_2e0;
  uint *local_2d8;
  uint *local_2d0;
  uint *local_2c8;
  uint *local_2c0;
  uint *local_2b8;
  uint *local_2b0;
  uint *local_2a8;
  uint *local_2a0;
  uint *local_298;
  uint *local_290;
  uint *local_288;
  undefined4 *local_280;
  undefined4 *local_278;
  uint *local_270;
  undefined4 *local_268;
  undefined4 *local_260;
  uint *local_258;
  uint *local_250;
  uint *local_248;
  uint *local_240;
  uint *local_238;
  uint *local_230;
  uint *local_228;
  uint *local_220;
  uint *local_218;
  uint *local_210;
  uint *local_208;
  uint *local_200;
  uint *local_1f8;
  undefined4 local_1ec;
  OpRWFlags *local_1e8;
  undefined4 local_1dc;
  OpRWFlags *local_1d8;
  undefined4 local_1cc;
  OpRWFlags *local_1c8;
  undefined4 local_1bc;
  OpRWFlags *local_1b8;
  undefined4 local_1ac;
  OpRWFlags *local_1a8;
  undefined4 local_19c;
  OpRWFlags *local_198;
  undefined4 local_18c;
  OpRWFlags *local_188;
  undefined4 local_17c;
  OpRWFlags *local_178;
  undefined4 local_16c;
  OpRWFlags *local_168;
  undefined4 local_15c;
  OpRWFlags *local_158;
  undefined4 local_14c;
  OpRWFlags *local_148;
  undefined4 local_13c;
  uint *local_138;
  uint local_130;
  undefined4 local_12c;
  uint *local_128;
  uint local_120;
  undefined4 local_11c;
  uint *local_118;
  uint local_110;
  undefined4 local_10c;
  uint *local_108;
  uint local_100;
  undefined4 local_fc;
  uint *local_f8;
  uint local_f0;
  undefined4 local_ec;
  uint *local_e8;
  uint local_e0;
  undefined4 local_dc;
  uint *local_d8;
  undefined4 local_cc;
  uint *local_c8;
  undefined4 local_bc;
  uint *local_b8;
  undefined4 local_ac;
  uint *local_a8;
  undefined4 local_9c;
  uint *local_98;
  undefined4 local_8c;
  uint *local_88;
  undefined1 local_7a;
  undefined1 local_79;
  uint *local_78;
  uint *local_70;
  uint *local_68;
  uint *local_60;
  uint *local_58;
  uint *local_50;
  uint *local_48;
  uint *local_40;
  uint *local_38;
  uint *local_30;
  uint *local_28;
  uint *local_20;
  uint *local_18;
  uint *local_10;
  uint *local_8;
  
  local_504 = *in_RDI & 0xffff;
  local_4dc = local_504;
  if (local_504 < 0x2fd) {
    *in_RCX = 0;
    *(char *)(in_RCX + 3) = (char)in_RDX;
    *(undefined1 *)((long)in_RCX + 0xd) = 0;
    local_500 = in_RCX;
    local_4f8 = in_RDX;
    local_4f0 = in_RSI;
    local_460 = (undefined8 *)(in_RCX + 8);
    memset(&local_480,0,0x20);
    *(undefined8 *)(in_RCX + 8) = local_480;
    *(undefined8 *)(in_RCX + 10) = local_478;
    *(undefined8 *)(in_RCX + 0xc) = local_470;
    *(undefined8 *)(in_RCX + 0xe) = local_468;
    local_500[1] = 0;
    local_500[2] = 0;
    lVar5 = (ulong)local_504 * 8;
    local_510 = InstDB::_instInfoTable + lVar5;
    local_518 = instRWInfoData + (ulong)*(ushort *)(InstDB::_instInfoTable + lVar5 + 4) * 6;
    local_44c = 0x80;
    local_458 = local_510;
    local_448 = local_510;
    if (((*(ushort *)(InstDB::_instInfoTable + lVar5 + 6) & 0x80) == 0) || (local_4f8 < 3)) {
      for (local_554 = 0; local_554 < local_4f8; local_554 = local_554 + 1) {
        pOVar3 = local_500 + (ulong)local_554 * 8 + 0x10;
        local_568 = (uint *)(local_4f0 + (ulong)local_554 * 0x10);
        local_434 = *local_568 & 7;
        local_438 = 1;
        local_43c = 2;
        local_258 = &local_434;
        local_260 = &local_438;
        local_268 = &local_43c;
        local_5c5 = local_434 == 0 || 2 < local_434;
        local_560 = pOVar3;
        local_430 = local_568;
        local_238 = local_568;
        local_230 = local_568;
        local_1f8 = local_568;
        if (local_5c5) {
          local_4b0 = pOVar3;
          memset(&local_4d0,0,0x20);
          *(undefined8 *)pOVar3 = local_4d0;
          *(undefined8 *)(pOVar3 + 2) = local_4c8;
          *(undefined8 *)(pOVar3 + 4) = local_4c0;
          *(undefined8 *)(pOVar3 + 6) = local_4b8;
        }
        else {
          local_56c = (OpRWFlags)local_518[local_554];
          local_400 = 0x10;
          local_410 = 0xffffffef;
          *pOVar3 = local_56c & ~kZExt;
          *(undefined1 *)(pOVar3 + 1) = 0xff;
          *(byte *)((long)pOVar3 + 5) = 0;
          *(byte *)((long)pOVar3 + 7) = 0;
          local_1bc = 1;
          local_40c = local_56c;
          local_3f8 = pOVar3;
          local_3e8 = pOVar3;
          local_1b8 = pOVar3;
          bVar2 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>(*pOVar3,kRead);
          local_578 = kNone;
          if (bVar2) {
            local_578 = 0xffffffffffffffff;
          }
          local_3d8 = local_560;
          local_1d8 = local_560;
          local_1dc = 2;
          bVar2 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                            (*local_560,kWrite);
          local_580 = kNone;
          if (bVar2) {
            local_580 = 0xffffffffffffffff;
          }
          *(undefined8 *)(local_560 + 2) = local_578;
          *(undefined8 *)(local_560 + 4) = local_580;
          local_560[6] = kNone;
          local_560[7] = kNone;
          *(byte *)((long)local_560 + 6) = 0;
          local_3c8 = local_568;
          local_248 = local_568;
          local_220 = local_568;
          local_208 = local_568;
          if ((*local_568 & 7) == 1) {
            local_2a8 = local_568;
            local_2a0 = local_568;
            local_18 = local_568;
            if ((*local_568 & 0x8000) != 0) {
              local_2b0 = local_568;
              local_298 = local_568;
              local_10 = local_568;
              local_584 = *local_568 >> 0xc & 7;
              local_2b8 = local_568;
              local_290 = local_568;
              local_8 = local_568;
              local_588 = *local_568 >> 0x10 & 0xf;
              bVar1 = *(byte *)((long)&elementTypeSize + (ulong)local_584);
              local_58c = (uint)bVar1;
              local_288 = &local_58c;
              uVar4 = (ulong)((int)(1L << (bVar1 & 0x3f)) - 1) << ((char)local_588 * bVar1 & 0x3f);
              *(undefined8 *)(local_560 + 2) = uVar4 & *(undefined8 *)(local_560 + 2);
              *(undefined8 *)(local_560 + 4) = uVar4 & *(undefined8 *)(local_560 + 4);
            }
          }
          else {
            local_348 = local_568;
            local_330 = local_568;
            local_e8 = local_568;
            local_ec = 0xf8;
            local_334 = *local_568 & 0xf8;
            local_88 = &local_334;
            local_8c = 0;
            if (local_334 != 0) {
              local_390 = local_560;
              local_394 = 0x1000;
              local_168 = local_560;
              local_16c = 0x1000;
              *local_560 = *local_560 | kMemBaseRead;
              local_300 = local_568;
              local_118 = local_568;
              local_11c = 0x1f00;
              local_304 = *local_568 & 0x1f00;
              local_b8 = &local_304;
              local_bc = 0;
              local_110 = local_304;
              if (local_304 == 0) {
                local_2d8 = local_568;
                local_70 = local_568;
                local_68 = local_568;
                local_50 = local_568;
                local_48 = local_568;
                local_79 = (*local_568 >> 3 & 0x1f) == 0;
                if (local_568[3] == 0 && (local_568[1] & -(uint)(byte)local_79) == 0)
                goto LAB_0019b596;
              }
              local_2c8 = local_568;
              local_30 = local_568;
              local_28 = local_568;
              if ((*local_568 >> 0x18 & 3) != 0) {
                local_3a0 = local_560;
                local_3a4 = 0x2000;
                local_158 = local_560;
                local_15c = 0x2000;
                *local_560 = *local_560 | kMemBaseWrite;
              }
            }
LAB_0019b596:
            local_310 = local_568;
            local_108 = local_568;
            local_10c = 0x1f00;
            local_314 = *local_568 & 0x1f00;
            local_a8 = &local_314;
            local_ac = 0;
            local_100 = local_314;
            local_e0 = local_334;
            if (local_314 != 0) {
              local_3b0 = local_560;
              local_3b4 = 0x4000;
              local_148 = local_560;
              local_14c = 0x4000;
              *local_560 = *local_560 | kMemIndexRead;
            }
          }
        }
      }
    }
    else {
      for (local_51c = 0; local_51c < local_4f8; local_51c = local_51c + 1) {
        pOVar3 = local_500 + (ulong)local_51c * 8 + 0x10;
        local_530 = (uint *)(local_4f0 + (ulong)local_51c * 0x10);
        local_41c = *local_530 & 7;
        local_420 = 1;
        local_424 = 2;
        local_270 = &local_41c;
        local_278 = &local_420;
        local_280 = &local_424;
        local_5b1 = local_41c == 0 || 2 < local_41c;
        local_528 = pOVar3;
        local_418 = local_530;
        local_240 = local_530;
        local_228 = local_530;
        local_200 = local_530;
        if (local_5b1) {
          local_488 = pOVar3;
          memset(&local_4a8,0,0x20);
          *(undefined8 *)pOVar3 = local_4a8;
          *(undefined8 *)(pOVar3 + 2) = local_4a0;
          *(undefined8 *)(pOVar3 + 4) = local_498;
          *(undefined8 *)(pOVar3 + 6) = local_490;
        }
        else {
          if ((ulong)local_51c < local_4f8 - 1) {
            bVar1 = *local_518;
          }
          else {
            bVar1 = local_518[1];
          }
          local_5c4 = (OpRWFlags)bVar1;
          local_534 = local_5c4;
          local_3fc = 0x10;
          local_408 = 0xffffffef;
          local_404 = local_5c4;
          *pOVar3 = local_5c4 & ~kZExt;
          *(undefined1 *)(pOVar3 + 1) = 0xff;
          *(byte *)((long)pOVar3 + 5) = 0;
          *(byte *)((long)pOVar3 + 7) = 0;
          local_1cc = 1;
          local_3f0 = pOVar3;
          local_3e0 = pOVar3;
          local_1c8 = pOVar3;
          bVar2 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>(*pOVar3,kRead);
          local_540 = kNone;
          if (bVar2) {
            local_540 = 0xffffffffffffffff;
          }
          local_3d0 = local_528;
          local_1e8 = local_528;
          local_1ec = 2;
          bVar2 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                            (*local_528,kWrite);
          local_548 = kNone;
          if (bVar2) {
            local_548 = 0xffffffffffffffff;
          }
          *(undefined8 *)(local_528 + 2) = local_540;
          *(undefined8 *)(local_528 + 4) = local_548;
          local_528[6] = kNone;
          local_528[7] = kNone;
          *(byte *)((long)local_528 + 6) = 0;
          local_3c0 = local_530;
          local_250 = local_530;
          local_218 = local_530;
          local_210 = local_530;
          if ((*local_530 & 7) == 1) {
            if (local_51c == 0) {
              *(byte *)((long)local_528 + 6) = (char)local_4f8 - 1;
            }
            else {
              local_350 = local_528;
              local_354 = 8;
              local_1a8 = local_528;
              local_1ac = 8;
              *local_528 = *local_528 | kConsecutive;
            }
          }
          else {
            local_340 = local_530;
            local_550 = local_530;
            local_320 = local_530;
            local_f8 = local_530;
            local_fc = 0xf8;
            local_324 = *local_530 & 0xf8;
            local_98 = &local_324;
            local_9c = 0;
            if (local_324 != 0) {
              local_360 = local_528;
              local_364 = 0x1000;
              local_198 = local_528;
              local_19c = 0x1000;
              *local_528 = *local_528 | kMemBaseRead;
              local_2e0 = local_530;
              local_138 = local_530;
              local_13c = 0x1f00;
              local_2e4 = *local_530 & 0x1f00;
              local_d8 = &local_2e4;
              local_dc = 0;
              local_130 = local_2e4;
              if (local_2e4 == 0) {
                local_2d0 = local_530;
                local_78 = local_530;
                local_60 = local_530;
                local_58 = local_530;
                local_40 = local_530;
                local_7a = (*local_530 >> 3 & 0x1f) == 0;
                if (local_530[3] == 0 && (local_530[1] & -(uint)(byte)local_7a) == 0)
                goto LAB_0019ad90;
              }
              local_2c0 = local_530;
              local_38 = local_530;
              local_20 = local_530;
              if ((*local_530 >> 0x18 & 3) != 0) {
                local_370 = local_528;
                local_374 = 0x2000;
                local_188 = local_528;
                local_18c = 0x2000;
                *local_528 = *local_528 | kMemBaseWrite;
              }
            }
LAB_0019ad90:
            local_2f0 = local_530;
            local_128 = local_530;
            local_12c = 0x1f00;
            local_2f4 = *local_530 & 0x1f00;
            local_c8 = &local_2f4;
            local_cc = 0;
            local_120 = local_2f4;
            local_f0 = local_324;
            if (local_2f4 != 0) {
              local_380 = local_528;
              local_384 = 0x4000;
              local_178 = local_528;
              local_17c = 0x4000;
              *local_528 = *local_528 | kMemIndexRead;
            }
          }
        }
      }
    }
    local_4e0 = 0;
  }
  else {
    local_4e0 = DebugUtils::errored(0x1a);
  }
  return local_4e0;
}

Assistant:

Error queryRWInfo(const BaseInst& inst, const Operand_* operands, size_t opCount, InstRWInfo* out) noexcept {
  // Get the instruction data.
  uint32_t realId = inst.id() & uint32_t(InstIdParts::kRealId);

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(realId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  out->_instFlags = InstRWFlags::kNone;
  out->_opCount = uint8_t(opCount);
  out->_rmFeature = 0;
  out->_extraReg.reset();
  out->_readFlags = CpuRWFlags::kNone; // TODO: [ARM] Read PSTATUS.
  out->_writeFlags = CpuRWFlags::kNone; // TODO: [ARM] Write PSTATUS

  const InstDB::InstInfo& instInfo = InstDB::_instInfoTable[realId];
  const InstRWInfoData& rwInfo = instRWInfoData[instInfo.rwInfoIndex()];

  if (instInfo.hasFlag(InstDB::kInstFlagConsecutive) && opCount > 2) {
    for (uint32_t i = 0; i < opCount; i++) {
      OpRWInfo& op = out->_operands[i];
      const Operand_& srcOp = operands[i];

      if (!srcOp.isRegOrMem()) {
        op.reset();
        continue;
      }

      OpRWFlags rwFlags = i < opCount - 1 ? (OpRWFlags)rwInfo.rwx[0] : (OpRWFlags)rwInfo.rwx[1];

      op._opFlags = rwFlags & ~(OpRWFlags::kZExt);
      op._physId = BaseReg::kIdBad;
      op._rmSize = 0;
      op._resetReserved();

      uint64_t rByteMask = op.isRead() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;
      uint64_t wByteMask = op.isWrite() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;

      op._readByteMask = rByteMask;
      op._writeByteMask = wByteMask;
      op._extendByteMask = 0;
      op._consecutiveLeadCount = 0;

      if (srcOp.isReg()) {
        if (i == 0)
          op._consecutiveLeadCount = uint8_t(opCount - 1);
        else
          op.addOpFlags(OpRWFlags::kConsecutive);
      }
      else {
        const Mem& memOp = srcOp.as<Mem>();

        if (memOp.hasBase()) {
          op.addOpFlags(OpRWFlags::kMemBaseRead);
          if ((memOp.hasIndex() || memOp.hasOffset()) && memOp.isPreOrPost()) {
            op.addOpFlags(OpRWFlags::kMemBaseWrite);
          }
        }

        if (memOp.hasIndex()) {
          op.addOpFlags(OpRWFlags::kMemIndexRead);
        }
      }
    }
  }
  else {
    for (uint32_t i = 0; i < opCount; i++) {
      OpRWInfo& op = out->_operands[i];
      const Operand_& srcOp = operands[i];

      if (!srcOp.isRegOrMem()) {
        op.reset();
        continue;
      }

      OpRWFlags rwFlags = (OpRWFlags)rwInfo.rwx[i];

      op._opFlags = rwFlags & ~(OpRWFlags::kZExt);
      op._physId = BaseReg::kIdBad;
      op._rmSize = 0;
      op._resetReserved();

      uint64_t rByteMask = op.isRead() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;
      uint64_t wByteMask = op.isWrite() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;

      op._readByteMask = rByteMask;
      op._writeByteMask = wByteMask;
      op._extendByteMask = 0;
      op._consecutiveLeadCount = 0;

      if (srcOp.isReg()) {
        if (srcOp.as<Vec>().hasElementIndex()) {
          // Only part of the vector is accessed if element index [] is used.
          VecElementType elementType = srcOp.as<Vec>().elementType();
          uint32_t elementIndex = srcOp.as<Vec>().elementIndex();

          uint32_t elementSize = elementTypeSize[size_t(elementType)];
          uint64_t accessMask = uint64_t(Support::lsbMask<uint32_t>(elementSize)) << (elementIndex * elementSize);

          op._readByteMask &= accessMask;
          op._writeByteMask &= accessMask;
        }

        // TODO: [ARM] RW info is not finished.
      }
      else {
        const Mem& memOp = srcOp.as<Mem>();

        if (memOp.hasBase()) {
          op.addOpFlags(OpRWFlags::kMemBaseRead);
          if ((memOp.hasIndex() || memOp.hasOffset()) && memOp.isPreOrPost()) {
            op.addOpFlags(OpRWFlags::kMemBaseWrite);
          }
        }

        if (memOp.hasIndex()) {
          op.addOpFlags(OpRWFlags::kMemIndexRead);
        }
      }
    }
  }

  return kErrorOk;
}